

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::
Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
convert_down(Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
             *this,Boxed_Value *param_1)

{
  bad_boxed_type_cast *this_00;
  Static_String local_18;
  
  this_00 = (bad_boxed_type_cast *)__cxa_allocate_exception(0x38);
  local_18.m_size = 0x14;
  local_18.data = "No conversion exists";
  chaiscript::exception::bad_boxed_type_cast::bad_boxed_type_cast(this_00,&local_18);
  __cxa_throw(this_00,&chaiscript::exception::bad_boxed_type_cast::typeinfo,std::bad_cast::~bad_cast
             );
}

Assistant:

Boxed_Value convert_down(const Boxed_Value &) const override {
        throw chaiscript::exception::bad_boxed_type_cast("No conversion exists");
      }